

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScapeGoatTree.cpp
# Opt level: O0

Node * __thiscall ScapeGoatTree::buildBalanced(ScapeGoatTree *this,Node **a,int i,int ns)

{
  int ns_00;
  Node *pNVar1;
  int m;
  int ns_local;
  int i_local;
  Node **a_local;
  ScapeGoatTree *this_local;
  
  if (ns == 0) {
    this_local = (ScapeGoatTree *)0x0;
  }
  else {
    ns_00 = ns / 2;
    pNVar1 = buildBalanced(this,a,i,ns_00);
    a[i + ns_00]->leftChild = pNVar1;
    if (a[i + ns_00]->leftChild != (Node *)0x0) {
      a[i + ns_00]->leftChild->parent = a[i + ns_00];
    }
    pNVar1 = buildBalanced(this,a,i + ns_00 + 1,(ns - ns_00) + -1);
    a[i + ns_00]->rightChild = pNVar1;
    if (a[i + ns_00]->rightChild != (Node *)0x0) {
      a[i + ns_00]->rightChild->parent = a[i + ns_00];
    }
    this_local = (ScapeGoatTree *)a[i + ns_00];
  }
  return (Node *)this_local;
}

Assistant:

ScapeGoatTree::Node *ScapeGoatTree::buildBalanced(Node **a, int i, int ns) {
    if (ns == 0) {
        return nullptr;
    }
    int m = ns / 2;
    a[i + m]->leftChild = buildBalanced(a, i, m);
    if (a[i + m]->leftChild != nullptr) {
        a[i + m]->leftChild->parent = a[i + m];
    }
    a[i + m]->rightChild = buildBalanced(a, i + m + 1, ns - m - 1);
    if (a[i + m]->rightChild != nullptr) {
        a[i + m]->rightChild->parent = a[i + m];
    }
    return a[i + m];
}